

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_parse_url_path(connectdata *conn)

{
  curl_ftpfile cVar1;
  Curl_easy *data;
  size_t sVar2;
  CURLcode CVar3;
  int iVar4;
  char **ppcVar5;
  char *__dest;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  undefined8 *puVar9;
  char *pcVar10;
  size_t sStack_50;
  char *rawPath;
  undefined8 *local_40;
  size_t pathLen;
  
  data = conn->data;
  puVar9 = (undefined8 *)(data->req).protop;
  rawPath = (char *)0x0;
  pathLen = 0;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  CVar3 = Curl_urldecode(data,(char *)*puVar9,0,&rawPath,&pathLen,REJECT_CTRL);
  pcVar6 = rawPath;
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  cVar1 = (data->set).ftp_filemethod;
  if (cVar1 == FTPFILE_SINGLECWD) {
    local_40 = puVar9;
    pcVar10 = strrchr(rawPath,0x2f);
    puVar9 = local_40;
    if (pcVar10 == (char *)0x0) goto LAB_0011a726;
    sVar7 = (long)pcVar10 - (long)pcVar6;
    if ((long)pcVar10 - (long)pcVar6 == 0) {
      sVar7 = 1;
    }
    ppcVar5 = (char **)(*Curl_ccalloc)(1,8);
    (conn->proto).ftpc.dirs = ppcVar5;
    if (ppcVar5 == (char **)0x0) {
LAB_0011a709:
      (*Curl_cfree)(rawPath);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar6 = (char *)(*Curl_ccalloc)(1,sVar7 + 1);
    *(conn->proto).ftpc.dirs = pcVar6;
    pcVar6 = *(conn->proto).ftpc.dirs;
    if (pcVar6 == (char *)0x0) goto LAB_0011a709;
    strncpy(pcVar6,rawPath,sVar7);
    (conn->proto).ftpc.dirdepth = 1;
    pcVar6 = pcVar10 + 1;
    puVar9 = local_40;
  }
  else {
    if (cVar1 != FTPFILE_NOCWD) {
      iVar4 = 0;
      pcVar10 = rawPath;
      do {
        if (*pcVar10 == '/') {
          iVar4 = iVar4 + 1;
        }
        else if (*pcVar10 == '\0') goto LAB_0011a66f;
        pcVar10 = pcVar10 + 1;
      } while( true );
    }
    if ((pathLen == 0) || (rawPath[pathLen - 1] == '/')) goto LAB_0011a740;
  }
LAB_0011a72b:
  if (*pcVar6 == '\0') goto LAB_0011a740;
  pcVar6 = (*Curl_cstrdup)(pcVar6);
LAB_0011a742:
  sVar2 = pathLen;
  (conn->proto).ftpc.file = pcVar6;
  if (((((data->set).field_0x97b & 0x20) != 0) && (pcVar6 == (char *)0x0)) &&
     (*(int *)(puVar9 + 2) == 0)) {
    Curl_failf(data,"Uploading to a URL without a file name!");
    (*Curl_cfree)(rawPath);
    return CURLE_URL_MALFORMAT;
  }
  (conn->proto).ftpc.cwddone = false;
  cVar1 = (data->set).ftp_filemethod;
  if ((cVar1 != FTPFILE_NOCWD) || (*rawPath != '/')) {
    if (((conn->bits).field_0x4 & 0x40) == 0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (conn->proto).ftpc.prevpath;
      if (pcVar10 == (char *)0x0) goto LAB_0011a81a;
    }
    if (cVar1 == FTPFILE_NOCWD) {
      sVar7 = 0;
    }
    else {
      if (pcVar6 == (char *)0x0) {
        sVar7 = 0;
      }
      else {
        sVar7 = strlen(pcVar6);
      }
      sVar7 = sVar2 - sVar7;
    }
    sVar8 = strlen(pcVar10);
    if ((sVar8 != sVar7) || (iVar4 = strncmp(rawPath,pcVar10,sVar7), iVar4 != 0)) goto LAB_0011a81a;
    Curl_infof(data,"Request has same path as previous transfer\n");
  }
  (conn->proto).ftpc.cwddone = true;
LAB_0011a81a:
  (*Curl_cfree)(rawPath);
  return CURLE_OK;
LAB_0011a66f:
  if (0 < iVar4) {
    ppcVar5 = (char **)(*Curl_ccalloc)((size_t)iVar4,8);
    (conn->proto).ftpc.dirs = ppcVar5;
    if (ppcVar5 == (char **)0x0) goto LAB_0011a709;
    while (local_40 = puVar9, pcVar10 = strchr(pcVar6,0x2f), puVar9 = local_40,
          pcVar10 != (char *)0x0) {
      sStack_50 = (long)pcVar10 - (long)pcVar6;
      if ((sStack_50 != 0) || (sStack_50 = 1, (conn->proto).ftpc.dirdepth == 0)) {
        __dest = (char *)(*Curl_ccalloc)(1,sStack_50 + 1);
        if (__dest == (char *)0x0) goto LAB_0011a709;
        strncpy(__dest,pcVar6,sStack_50);
        iVar4 = (conn->proto).ftpc.dirdepth;
        (conn->proto).ftpc.dirdepth = iVar4 + 1;
        (conn->proto).ftpc.dirs[iVar4] = __dest;
      }
      pcVar6 = pcVar10 + 1;
      puVar9 = local_40;
    }
  }
LAB_0011a726:
  if (pcVar6 != (char *)0x0) goto LAB_0011a72b;
LAB_0011a740:
  pcVar6 = (char *)0x0;
  goto LAB_0011a742;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(data, ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result)
    return result;

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/')) != NULL) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer\n");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}